

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void separate(vector<const_char_*,_std::allocator<const_char_*>_> *in,char *out,bool override)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  invalid_argument *this;
  char *pcVar5;
  MultiPartInputFile *pMVar6;
  ostream *poVar7;
  void *this_00;
  Header *pHVar8;
  string *psVar9;
  ostream *this_01;
  byte in_DL;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  string type;
  MultiPartOutputFile out_1;
  Header header;
  int p_1;
  ostringstream oss;
  string outfilename;
  int p;
  MultiPartInputFile temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  int numOutputs;
  MultiPartInputFile *inputimage;
  string filename;
  char *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  value_type *in_stack_fffffffffffffc28;
  ostream *in_stack_fffffffffffffc30;
  allocator<char> *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  string local_2e8 [32];
  MultiPartOutputFile local_2c8 [16];
  Header local_2b8 [60];
  int local_27c;
  string local_260 [32];
  ostringstream local_240 [383];
  allocator<char> local_c1;
  string local_c0 [36];
  int local_9c;
  MultiPartInputFile local_98 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  int local_5c;
  MultiPartInputFile *local_58;
  allocator<char> local_49;
  string local_48 [55];
  byte local_11;
  
  local_11 = in_DL & 1;
  sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  if (sVar4 < 2) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,
               (char *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               in_stack_fffffffffffffc50);
    std::allocator<char>::~allocator(&local_49);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10aa86);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_98,pcVar5,iVar3,true);
    pMVar6 = (MultiPartInputFile *)operator_new(0x20);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar6,pcVar5,iVar3,true);
    local_58 = pMVar6;
    local_5c = Imf_3_4::MultiPartInputFile::parts();
    poVar7 = std::operator<<((ostream *)&std::cout,"numOutputs: ");
    this_00 = (void *)std::ostream::operator<<(poVar7,local_5c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    for (local_9c = 0; local_9c < local_5c; local_9c = local_9c + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,
                 (char *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                 in_stack_fffffffffffffc50);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::ostringstream::ostringstream(local_240);
      poVar7 = std::operator<<((ostream *)local_240,'.');
      std::ostream::operator<<(poVar7,local_9c + 1);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(local_c0,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::operator+=(local_c0,".exr");
      poVar7 = std::operator<<((ostream *)&std::cout,"outputfilename: ");
      in_stack_fffffffffffffc90 = std::operator<<(poVar7,local_c0);
      std::ostream::operator<<(in_stack_fffffffffffffc90,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::__cxx11::ostringstream::~ostringstream(local_240);
      std::__cxx11::string::~string(local_c0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffc70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
    filename_check((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc30);
    for (local_27c = 0; local_27c < local_5c; local_27c = local_27c + 1) {
      pHVar8 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_58);
      Imf_3_4::Header::Header(local_2b8,pHVar8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_78,(long)local_27c);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = local_11;
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (local_2c8,pcVar5,local_2b8,1,(bool)(bVar1 & 1),iVar3);
      psVar9 = (string *)Imf_3_4::Header::type_abi_cxx11_();
      std::__cxx11::string::string(local_2e8,psVar9);
      bVar2 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (bVar2) {
        poVar7 = std::operator<<((ostream *)&std::cout,"scanlineimage");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        copy_scanline((MultiPartInputFile *)in_stack_fffffffffffffc30,
                      (MultiPartOutputFile *)in_stack_fffffffffffffc28,
                      (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),(int)in_stack_fffffffffffffc20
                     );
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)&std::cout,"tiledimage");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          copy_tile((MultiPartInputFile *)in_stack_fffffffffffffc30,
                    (MultiPartOutputFile *)in_stack_fffffffffffffc28,
                    (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),(int)in_stack_fffffffffffffc20);
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          if (bVar2) {
            poVar7 = std::operator<<((ostream *)&std::cout,"deepscanline");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            copy_scanlinedeep((MultiPartInputFile *)in_stack_fffffffffffffc30,
                              (MultiPartOutputFile *)in_stack_fffffffffffffc28,
                              (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                              (int)in_stack_fffffffffffffc20);
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            if (bVar2) {
              in_stack_fffffffffffffc30 = std::operator<<((ostream *)&std::cout,"deeptile");
              std::ostream::operator<<
                        (in_stack_fffffffffffffc30,std::endl<char,std::char_traits<char>>);
              copy_tiledeep((MultiPartInputFile *)in_stack_fffffffffffffc30,
                            (MultiPartOutputFile *)in_stack_fffffffffffffc28,
                            (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                            (int)in_stack_fffffffffffffc20);
            }
          }
        }
      }
      std::__cxx11::string::~string(local_2e8);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_2c8);
      Imf_3_4::Header::~Header(local_2b8);
    }
    if (local_58 != (MultiPartInputFile *)0x0) {
      pMVar6 = local_58;
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                ((MultiPartInputFile *)in_stack_fffffffffffffc20);
      operator_delete(pMVar6,0x20);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"\n");
    this_01 = std::operator<<(poVar7,"Separate Success");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)poVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc30);
    std::__cxx11::string::~string(local_48);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"-separate only take one input file");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
separate (vector<const char*> in, const char* out, bool override)
{
    if (in.size () > 1)
        throw invalid_argument ("-separate only take one input file");

    //
    // parse the multipart input
    //
    string              filename (in[0]);
    MultiPartInputFile* inputimage;
    int                 numOutputs;
    vector<string>      fornamecheck;

    // add check for existence of the file
    MultiPartInputFile temp (filename.c_str ());

    inputimage = new MultiPartInputFile (filename.c_str ());
    numOutputs = inputimage->parts ();
    cout << "numOutputs: " << numOutputs << endl;

    //
    // set outputs names
    //
    for (int p = 0; p < numOutputs; p++)
    {
        string outfilename (out);

        //add number to outfilename
        std::ostringstream oss;
        oss << '.' << p + 1;
        outfilename += oss.str ();
        outfilename += ".exr";
        cout << "outputfilename: " << outfilename << endl;
        fornamecheck.push_back (outfilename);
    }

    filename_check (fornamecheck, in[0]);

    //
    // separate outputs
    //
    for (int p = 0; p < numOutputs; p++)
    {
        Header header = inputimage->header (p);

        MultiPartOutputFile out (
            fornamecheck[p].c_str (), &header, 1, override);

        std::string type = header.type ();
        if (type == "scanlineimage")
        {
            cout << "scanlineimage" << endl;
            copy_scanline (*inputimage, out, p, 0);
        }
        else if (type == "tiledimage")
        {
            cout << "tiledimage" << endl;
            copy_tile (*inputimage, out, p, 0);
        }
        else if (type == "deepscanline")
        {
            cout << "deepscanline" << endl;
            copy_scanlinedeep (*inputimage, out, p, 0);
        }
        else if (type == "deeptile")
        {
            cout << "deeptile" << endl;
            copy_tiledeep (*inputimage, out, p, 0);
        }
    }

    delete inputimage;
    cout << "\n"
         << "Separate Success" << endl;
}